

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O3

void __thiscall
ParticleFilter::updateWeights
          (ParticleFilter *this,double sensor_range,double *std_landmark,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations,Map *map_landmarks)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pPVar3;
  pointer psVar4;
  pointer pLVar5;
  iterator iVar6;
  pointer psVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  LandmarkObs *pLVar11;
  pointer psVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> meas_map;
  LandmarkObs cur_meas_map;
  LandmarkObs *local_88;
  iterator iStack_80;
  LandmarkObs *local_78;
  ParticleFilter *local_70;
  double *local_68;
  double local_60;
  double local_58;
  double local_50;
  LandmarkObs local_48;
  
  if (this->num_particles != 0) {
    uVar15 = 0;
    local_70 = this;
    local_68 = std_landmark;
    do {
      pPVar3 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar17 = cos(pPVar3[uVar15].theta);
      local_50 = sin(pPVar3[uVar15].theta);
      local_58 = pPVar3[uVar15].x;
      local_60 = pPVar3[uVar15].y;
      local_88 = (LandmarkObs *)0x0;
      iStack_80._M_current = (LandmarkObs *)0x0;
      local_78 = (LandmarkObs *)0x0;
      pLVar5 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl
               .super__Vector_impl_data._M_start;
      if ((observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
          super__Vector_impl_data._M_finish == pLVar5) {
        pPVar3[uVar15].weight = 1.0;
        (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = 1.0;
      }
      else {
        uVar8 = 0;
        uVar10 = 1;
        do {
          local_48.x = (pLVar5[uVar8].x * dVar17 + local_58) - pLVar5[uVar8].y * local_50;
          local_48.y = pLVar5[uVar8].y * dVar17 + pLVar5[uVar8].x * local_50 + local_60;
          if (iStack_80._M_current == local_78) {
            std::vector<LandmarkObs,std::allocator<LandmarkObs>>::
            _M_realloc_insert<LandmarkObs_const&>
                      ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)&local_88,iStack_80,
                       &local_48);
          }
          else {
            (iStack_80._M_current)->y = local_48.y;
            (iStack_80._M_current)->id = local_48.id;
            *(undefined4 *)&(iStack_80._M_current)->field_0x4 = local_48._4_4_;
            (iStack_80._M_current)->x = local_48.x;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
          pLVar5 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar8 = ((long)(observations->
                         super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pLVar5 >> 3) *
                  -0x5555555555555555;
          bVar16 = uVar10 <= uVar8;
          lVar9 = uVar8 - uVar10;
          uVar8 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar16 && lVar9 != 0);
        pPVar3[uVar15].weight = 1.0;
        pLVar11 = local_88;
        if (iStack_80._M_current == local_88) {
          dVar17 = 1.0;
        }
        else {
          uVar8 = 0;
          dVar17 = 1.0;
          iVar6._M_current = iStack_80._M_current;
          do {
            psVar7 = (map_landmarks->landmark_list).
                     super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar9 = (long)(map_landmarks->landmark_list).
                          super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7;
            if (lVar9 != 0) {
              uVar10 = (lVar9 >> 2) * -0x5555555555555555;
              uVar13 = 1;
              psVar12 = (pointer)0x0;
              dVar20 = sensor_range * sensor_range;
              do {
                dVar21 = (double)psVar7->x_f - pLVar11[uVar8].x;
                dVar22 = (double)psVar7->y_f - pLVar11[uVar8].y;
                dVar21 = dVar21 * dVar21 + dVar22 * dVar22;
                psVar4 = psVar7;
                if (dVar20 <= dVar21) {
                  dVar21 = dVar20;
                  psVar4 = psVar12;
                }
                psVar12 = psVar4;
                dVar20 = dVar21;
                uVar14 = (ulong)uVar13;
                psVar7 = psVar7 + 1;
                uVar13 = uVar13 + 1;
              } while (uVar14 <= uVar10 && uVar10 - uVar14 != 0);
              if (psVar12 != (pointer)0x0) {
                uVar1 = psVar12->x_f;
                uVar2 = psVar12->y_f;
                dVar21 = pLVar11[uVar8].x - (double)(float)uVar1;
                dVar22 = pLVar11[uVar8].y - (double)(float)uVar2;
                dVar17 = *local_68;
                dVar20 = local_68[1];
                auVar18._0_8_ = dVar21 * dVar21;
                auVar18._8_8_ = dVar22 * dVar22;
                auVar19._8_8_ = dVar20 * dVar20 + dVar20 * dVar20;
                auVar19._0_8_ = dVar17 * dVar17 + dVar17 * dVar17;
                auVar19 = divpd(auVar18,auVar19);
                dVar21 = exp(-(auVar19._8_8_ + auVar19._0_8_));
                dVar17 = dVar21 * (1.0 / (dVar20 * dVar17 * 6.283185307179586)) *
                         pPVar3[uVar15].weight;
                pPVar3[uVar15].weight = dVar17;
                iVar6._M_current = iStack_80._M_current;
                pLVar11 = local_88;
              }
            }
            uVar8 = (ulong)((int)uVar8 + 1);
            uVar10 = ((long)iVar6._M_current - (long)pLVar11 >> 3) * -0x5555555555555555;
          } while (uVar8 <= uVar10 && uVar10 - uVar8 != 0);
        }
        this = local_70;
        (local_70->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] = dVar17;
        if (pLVar11 != (LandmarkObs *)0x0) {
          operator_delete(pLVar11);
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < this->num_particles);
  }
  return;
}

Assistant:

void ParticleFilter::updateWeights(const double sensor_range, const double std_landmark[], 
		const std::vector<LandmarkObs>& observations, const Map& map_landmarks) 
{
	// TODO: Update the weights of each particle using a mult-variate Gaussian distribution. You can read
	//   more about this distribution here: https://en.wikipedia.org/wiki/Multivariate_normal_distribution
	// NOTE: The observations are given in the VEHICLE'S coordinate system. Your particles are located
	//   according to the MAP'S coordinate system. You will need to transform between the two systems.
	//   Keep in mind that this transformation requires both rotation AND translation (but no scaling).
	//   The following is a good resource for the theory:
	//   https://www.willamette.edu/~gorr/classes/GeneralGraphics/Transforms/transforms2d.htm
	//   and the following is a good resource for the actual equation to implement (look at equation 
	//   3.33. Note that you'll need to switch the minus sign in that equation to a plus to account 
	//   for the fact that the map's y-axis actually points downwards.)
	//   http://planning.cs.uiuc.edu/node99.html
    const double sensor_range_squared = sensor_range*sensor_range;

    for (unsigned int i = 0; i < num_particles; ++i)
    {
        Particle& cur_particle        = particles[i];
        const double cosThetaParticle = std::cos(cur_particle.theta);
        const double sinThetaParticle = std::sin(cur_particle.theta);
        const double xParticle        = cur_particle.x;
        const double yParticle        = cur_particle.y;

        std::vector<LandmarkObs> meas_map;
        for (unsigned int j = 0; j < observations.size(); ++j)
        {
            const LandmarkObs& cur_meas_veh = observations[j];
            LandmarkObs cur_meas_map;

            //Transform from vehicle to map
            cur_meas_map.x = xParticle  + cur_meas_veh.x*cosThetaParticle - cur_meas_veh.y*sinThetaParticle;
            cur_meas_map.y = yParticle  + cur_meas_veh.x*sinThetaParticle + cur_meas_veh.y*cosThetaParticle;
            meas_map.push_back(cur_meas_map);
        }

        cur_particle.weight = 1.0;

        for(unsigned int j = 0; j < meas_map.size(); ++j)
        {
            const LandmarkObs& cur_mea_map = meas_map[j];
            double min_dist_squared = sensor_range_squared;
            const Map::single_landmark_s* closestLm = NULL;

            for (unsigned int k = 0; k < map_landmarks.landmark_list.size(); ++k) 
            {
                const Map::single_landmark_s& cur_lm = map_landmarks.landmark_list[k];
                const double x_lm = cur_lm.x_f;
                const double y_lm = cur_lm.y_f;

                const double cur_dist_squared = distSquared(cur_mea_map.x, cur_mea_map.y, x_lm, y_lm);
                if(cur_dist_squared < min_dist_squared)
                {
                    min_dist_squared = cur_dist_squared;
                    closestLm = &cur_lm;
                }
            }

            if(closestLm)
            {
                const double x_meas   = cur_mea_map.x;
                const double y_meas   = cur_mea_map.y;
                const double x_mu     = closestLm->x_f;
                const double y_mu     = closestLm->y_f;
                const double measProb = 1/(2.0*PI*std_landmark[0]*std_landmark[1])*std::exp(-(std::pow(x_meas-x_mu,2.0)/(2.0*pow(std_landmark[0],2.0))+pow(y_meas-y_mu,2.0)/(2.0*pow(std_landmark[1],2.0))));
                cur_particle.weight   *= measProb;
            }
        }
        weights[i] = cur_particle.weight;
    }
}